

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

void __thiscall duckdb::RowGroup::InitializeAppend(RowGroup *this,RowGroupAppendState *append_state)

{
  __uniq_ptr_impl<duckdb::ColumnAppendState,_std::default_delete<duckdb::ColumnAppendState[]>_> __p;
  tuple<duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_> in_RAX;
  ColumnData *pCVar1;
  long lVar2;
  idx_t i;
  ulong c;
  __uniq_ptr_impl<duckdb::ColumnAppendState,_std::default_delete<duckdb::ColumnAppendState[]>_>
  local_28;
  
  append_state->row_group = this;
  append_state->offset_in_row_group =
       (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>._M_i;
  local_28._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>
  .super__Head_base<0UL,_duckdb::ColumnAppendState_*,_false>._M_head_impl =
       (tuple<duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>)
       (tuple<duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>)
       in_RAX.
       super__Tuple_impl<0UL,_duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>
       .super__Head_base<0UL,_duckdb::ColumnAppendState_*,_false>._M_head_impl;
  make_unsafe_uniq_array<duckdb::ColumnAppendState>
            ((duckdb *)&local_28,
             (long)(this->columns).
                   super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   .
                   super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->columns).
                   super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   .
                   super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  __p._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>
  .super__Head_base<0UL,_duckdb::ColumnAppendState_*,_false>._M_head_impl =
       local_28._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>
       .super__Head_base<0UL,_duckdb::ColumnAppendState_*,_false>._M_head_impl;
  local_28._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>
  .super__Head_base<0UL,_duckdb::ColumnAppendState_*,_false>._M_head_impl =
       (tuple<duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>)
       (_Tuple_impl<0UL,_duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>
        )0x0;
  ::std::
  __uniq_ptr_impl<duckdb::ColumnAppendState,_std::default_delete<duckdb::ColumnAppendState[]>_>::
  reset((__uniq_ptr_impl<duckdb::ColumnAppendState,_std::default_delete<duckdb::ColumnAppendState[]>_>
         *)&append_state->states,
        (pointer)__p._M_t.
                 super__Tuple_impl<0UL,_duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>
                 .super__Head_base<0UL,_duckdb::ColumnAppendState_*,_false>._M_head_impl);
  ::std::unique_ptr<duckdb::ColumnAppendState[],_std::default_delete<duckdb::ColumnAppendState[]>_>
  ::~unique_ptr((unique_ptr<duckdb::ColumnAppendState[],_std::default_delete<duckdb::ColumnAppendState[]>_>
                 *)&local_28);
  lVar2 = 0;
  for (c = 0; c < (ulong)((long)(this->columns).
                                super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                .
                                super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->columns).
                                super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                .
                                super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4); c = c + 1) {
    pCVar1 = GetColumn(this,c);
    (*pCVar1->_vptr_ColumnData[0x11])
              (pCVar1,(long)&((append_state->states).
                              super_unique_ptr<duckdb::ColumnAppendState[],_std::default_delete<duckdb::ColumnAppendState[]>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::ColumnAppendState,_std::default_delete<duckdb::ColumnAppendState[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>
                              .super__Head_base<0UL,_duckdb::ColumnAppendState_*,_false>.
                             _M_head_impl)->current + lVar2);
    lVar2 = lVar2 + 0x30;
  }
  return;
}

Assistant:

void RowGroup::InitializeAppend(RowGroupAppendState &append_state) {
	append_state.row_group = this;
	append_state.offset_in_row_group = this->count;
	// for each column, initialize the append state
	append_state.states = make_unsafe_uniq_array<ColumnAppendState>(GetColumnCount());
	for (idx_t i = 0; i < GetColumnCount(); i++) {
		auto &col_data = GetColumn(i);
		col_data.InitializeAppend(append_state.states[i]);
	}
}